

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QObject*,QObject*>::emplace_helper<QObject*>
          (QHash<QObject_*,_QObject_*> *this,QObject **key,QObject **args)

{
  long lVar1;
  piter it;
  piter pVar2;
  Node<QObject_*,_QObject_*> *n;
  iterator<QHashPrivate::Node<QObject_*,_QObject_*>_> *in_RDX;
  Data<QHashPrivate::Node<QObject_*,_QObject_*>_> *in_RSI;
  long in_FS_OFFSET;
  InsertionResult result;
  iterator *in_stack_ffffffffffffff88;
  Data<QHashPrivate::Node<QObject_*,_QObject_*>_> *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  undefined8 local_30;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHashPrivate::Data<QHashPrivate::Node<QObject*,QObject*>>::findOrInsert<QObject*>
            (in_RSI,(QObject **)in_RDX);
  n = QHashPrivate::iterator<QHashPrivate::Node<QObject_*,_QObject_*>_>::node(in_RDX);
  QHashPrivate::Node<QObject*,QObject*>::createInPlace<QObject*>
            (n,(QObject **)in_RSI,(QObject **)in_RDX);
  it.bucket = in_stack_ffffffffffffff98;
  it.d = in_stack_ffffffffffffff90;
  QHash<QObject_*,_QObject_*>::iterator::iterator(in_stack_ffffffffffffff88,it);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  pVar2.bucket = local_28;
  pVar2.d = local_30;
  return (iterator)pVar2;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }